

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUF_MEM_grow(BUF_MEM *str,size_t len)

{
  size_t len_00;
  char *func;
  size_t n;
  char *ret;
  BUF_MEM *in_stack_ffffffffffffffe0;
  size_t local_8;
  
  if (str->length < len) {
    if (str->max < len) {
      if (len < 0x5ffffffd) {
        len_00 = (len + 3) / 3 << 2;
        if ((str[1].length & 1) == 0) {
          func = (char *)CRYPTO_realloc(str->data,(int)len_00,"crypto/buffer/buffer.c",0x61);
        }
        else {
          func = sec_alloc_realloc(in_stack_ffffffffffffffe0,len_00);
        }
        if (func == (char *)0x0) {
          ERR_new();
          ERR_set_debug((char *)str,(int)(len >> 0x20),func);
          ERR_set_error(7,0xc0100,(char *)0x0);
          local_8 = 0;
        }
        else {
          str->data = func;
          str->max = len_00;
          memset(str->data + str->length,0,len - str->length);
          str->length = len;
          local_8 = len;
        }
      }
      else {
        ERR_new();
        ERR_set_debug((char *)str,(int)(len >> 0x20),(char *)in_stack_ffffffffffffffe0);
        ERR_set_error(7,0xc0100,(char *)0x0);
        local_8 = 0;
      }
    }
    else {
      if (str->data != (char *)0x0) {
        memset(str->data + str->length,0,len - str->length);
      }
      str->length = len;
      local_8 = len;
    }
  }
  else {
    str->length = len;
    local_8 = len;
  }
  return (int)local_8;
}

Assistant:

size_t BUF_MEM_grow(BUF_MEM *str, size_t len)
{
    char *ret;
    size_t n;

    if (str->length >= len) {
        str->length = len;
        return len;
    }
    if (str->max >= len) {
        if (str->data != NULL)
            memset(&str->data[str->length], 0, len - str->length);
        str->length = len;
        return len;
    }
    /* This limit is sufficient to ensure (len+3)/3*4 < 2**31 */
    if (len > LIMIT_BEFORE_EXPANSION) {
        ERR_raise(ERR_LIB_BUF, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    n = (len + 3) / 3 * 4;
    if ((str->flags & BUF_MEM_FLAG_SECURE))
        ret = sec_alloc_realloc(str, n);
    else
        ret = OPENSSL_realloc(str->data, n);
    if (ret == NULL) {
        ERR_raise(ERR_LIB_BUF, ERR_R_MALLOC_FAILURE);
        len = 0;
    } else {
        str->data = ret;
        str->max = n;
        memset(&str->data[str->length], 0, len - str->length);
        str->length = len;
    }
    return len;
}